

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_pgroup_destroy(Integer grp_id)

{
  int iVar1;
  proc_list_t *ppVar2;
  uint uVar3;
  ulong uVar4;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  ARMCI_Group_free(&PGRP_LIST[grp_id].group);
  uVar3 = 0;
  do {
    while (GA[uVar3].actv == 0) {
      uVar3 = uVar3 + 1;
      if (_max_global_array <= (int)uVar3) {
LAB_00163c57:
        ppVar2 = PGRP_LIST;
        iVar1 = PGRP_LIST[grp_id].actv;
        PGRP_LIST[grp_id].actv = 0;
        free(ppVar2[grp_id].map_proc_list);
        return (ulong)(iVar1 != 0);
      }
    }
    uVar4 = (ulong)uVar3;
  } while ((GA[uVar4].p_handle != (int)grp_id) &&
          (uVar3 = uVar3 + 1, (int)uVar3 < _max_global_array));
  if (GA[uVar4].p_handle == (int)grp_id) {
    pnga_error("Attempt to destroy process group with attached GAs",grp_id);
  }
  goto LAB_00163c57;
}

Assistant:

logical pnga_pgroup_destroy(Integer grp_id)
{
  logical ret = TRUE;
  int i, ok;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/

#ifdef MSG_COMMS_MPI
       ARMCI_Group_free(&PGRP_LIST[grp_id].group);
#endif
  /* check to make sure there are no GAs that depend on this process group */
  i=0;
  ok = 1;
  do{
      if (GA[i].actv) {
        if(GA[i].p_handle == (int)grp_id && GA[i].actv) ok = 0;
      }
      i++;
  }while(i<_max_global_array && ok);
  if (!ok) pnga_error("Attempt to destroy process group with attached GAs",grp_id);
  
  if (PGRP_LIST[grp_id].actv == 0) {
    ret = FALSE;
  }
  PGRP_LIST[grp_id].actv = 0;

  /* Deallocate memory for lists */
  free(PGRP_LIST[grp_id].map_proc_list);
  return ret;
}